

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

void st__free_table(st__table *table)

{
  st__table_entry *psVar1;
  int iVar2;
  st__table_entry *__ptr;
  long lVar3;
  
  iVar2 = table->num_bins;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      __ptr = table->bins[lVar3];
      if (table->bins[lVar3] != (st__table_entry *)0x0) {
        do {
          psVar1 = __ptr->next;
          free(__ptr);
          __ptr = psVar1;
        } while (psVar1 != (st__table_entry *)0x0);
        iVar2 = table->num_bins;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  if (table->bins != (st__table_entry **)0x0) {
    free(table->bins);
  }
  free(table);
  return;
}

Assistant:

void
 st__free_table( st__table *table)
{
    st__table_entry *ptr, *next;
    int i;

    for(i = 0; i < table->num_bins ; i++) {
    ptr = table->bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        ABC_FREE(ptr);
        ptr = next;
    }
    }
    ABC_FREE(table->bins);
    ABC_FREE(table);
}